

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.hpp
# Opt level: O1

void __thiscall spirv_cross::CompilerCPP::~CompilerCPP(CompilerCPP *this)

{
  pointer pcVar1;
  
  (this->super_CompilerGLSL).super_Compiler._vptr_Compiler =
       (_func_int **)&PTR__CompilerCPP_003fd5f0;
  pcVar1 = (this->interface_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->interface_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->resource_type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->resource_type).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->impl_type)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->impl_type).field_2) {
    operator_delete(pcVar1);
  }
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&this->resource_registrations);
  CompilerGLSL::~CompilerGLSL(&this->super_CompilerGLSL);
  operator_delete(this);
  return;
}

Assistant:

explicit CompilerCPP(std::vector<uint32_t> spirv_)
	    : CompilerGLSL(std::move(spirv_))
	{
	}